

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2pointutil.cc
# Opt level: O2

S2Point * S2::Ortho(S2Point *__return_storage_ptr__,S2Point *a)

{
  int iVar1;
  double *pdVar2;
  int b;
  Vector3<double> local_58;
  BasicVector<Vector3,_double,_3UL> local_38 [24];
  
  iVar1 = Vector3<double>::LargestAbsComponent(a);
  b = 2;
  if (0 < iVar1) {
    b = iVar1 + -1;
  }
  local_58.c_[0] = 0.012;
  local_58.c_[1] = 0.0053;
  local_58.c_[2] = 0.00457;
  pdVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator[]
                     ((BasicVector<Vector3,_double,_3UL> *)&local_58,b);
  *pdVar2 = 1.0;
  Vector3<double>::CrossProd(a,&local_58);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
            (__return_storage_ptr__,local_38);
  return __return_storage_ptr__;
}

Assistant:

S2Point Ortho(const S2Point& a) {
#ifdef S2_TEST_DEGENERACIES
  // Vector3::Ortho() always returns a point on the X-Y, Y-Z, or X-Z planes.
  // This leads to many more degenerate cases in polygon operations.
  return a.Ortho();
#else
  int k = a.LargestAbsComponent() - 1;
  if (k < 0) k = 2;
  S2Point temp(0.012, 0.0053, 0.00457);
  temp[k] = 1;
  return a.CrossProd(temp).Normalize();
#endif
}